

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseFunctionStmt(Parser *this,bool mustParseBody)

{
  line_t *plVar1;
  ulong *puVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __buckets_ptr pp_Var7;
  undefined8 *puVar8;
  Stmt SVar9;
  undefined8 *puVar10;
  undefined4 in_EDX;
  undefined8 uVar11;
  undefined7 in_register_00000031;
  Parser *this_00;
  size_type __dnew_1;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> params;
  Token name;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  undefined1 local_f8 [24];
  line_t local_e0;
  col_t local_dc;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_c0 [2];
  undefined1 local_a0 [16];
  _Alloc_hider _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_74;
  pointer local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  __buckets_ptr local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  CompileContext *local_38;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,mustParseBody);
  local_108 = (undefined1  [8])local_f8;
  local_70 = (pointer)0x17;
  local_108 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_108,(ulong)&local_70);
  local_f8._0_8_ = local_70;
  builtin_strncpy((char *)local_108,"Expected function name.",0x17);
  _Stack_100._M_p = local_70;
  *(char *)((long)local_108 + (long)local_70) = '\0';
  expect(this_00,IDENTIFIER,(string *)local_108);
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108,local_f8._0_8_ + 1);
  }
  local_70 = (pointer)CONCAT44(local_70._4_4_,(this_00->m_previous).type);
  local_68 = &local_58;
  pcVar3 = (this_00->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (this_00->m_previous).lexeme._M_string_length);
  local_48._M_allocated_capacity._4_2_ = (this_00->m_previous).col;
  local_48._M_allocated_capacity._0_4_ = (this_00->m_previous).line;
  local_108 = (undefined1  [8])local_f8;
  local_d8._16_8_ = (pointer)0x21;
  local_108 = (undefined1  [8])
              std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_d8 + 0x10));
  local_f8._0_8_ = local_d8._16_8_;
  builtin_strncpy((char *)local_108,"Expected \'(\' after function name.",0x21);
  _Stack_100._M_p = (pointer)local_d8._16_8_;
  *(char *)((long)local_108 + local_d8._16_8_) = '\0';
  expect(this_00,LEFT_PAREN,(string *)local_108);
  _local_74 = in_EDX;
  local_48._8_8_ = this;
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
  }
  plVar1 = &(this_00->m_previous).line;
  local_a0._8_8_ = (_func_int *)0x0;
  _Stack_90._M_p = (pointer)0x0;
  local_88._M_allocated_capacity = 0;
  if ((this_00->m_current).type == RIGHT_PAREN) {
    advance(this_00);
  }
  else {
    puVar2 = (ulong *)(local_d8 + 0x10);
    while( true ) {
      local_108 = (undefined1  [8])local_f8;
      local_d8._16_8_ = (pointer)0x18;
      local_108 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_108,(ulong)puVar2)
      ;
      local_f8._0_8_ = local_d8._16_8_;
      builtin_strncpy((char *)local_108,"Expected parameter name.",0x18);
      _Stack_100._M_p = (pointer)local_d8._16_8_;
      *(char *)((long)local_108 + local_d8._16_8_) = '\0';
      expect(this_00,IDENTIFIER,(string *)local_108);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
      }
      local_108._0_4_ = (this_00->m_previous).type;
      _Stack_100._M_p = local_f8 + 8;
      pcVar3 = (this_00->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_100,pcVar3,pcVar3 + (this_00->m_previous).lexeme._M_string_length
                );
      local_dc = (this_00->m_previous).col;
      local_e0 = *plVar1;
      local_a0._0_8_ = (CompileContext *)0x1c;
      local_d8._16_8_ = aaStack_c0[0]._M_local_buf + 8;
      local_d8._16_8_ = std::__cxx11::string::_M_create(puVar2,(ulong)local_a0);
      aaStack_c0[0]._8_8_ = local_a0._0_8_;
      builtin_strncpy((char *)local_d8._16_8_,"Expected parameter typename.",0x1c);
      aaStack_c0[0]._M_allocated_capacity = local_a0._0_8_;
      *(char *)(local_d8._16_8_ + (long)&((string *)local_a0._0_8_)->_M_dataplus) = '\0';
      expectTypenamePrecFunction((Parser *)local_d8,(string *)this_00,SUB81(puVar2,0));
      std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
      emplace_back<enact::FunctionStmt::Param>
                ((vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *)
                 (local_a0 + 8),(Param *)local_108);
      if ((Typename *)local_d8._0_8_ != (Typename *)0x0) {
        (*(*(_func_int ***)local_d8._0_8_)[1])();
      }
      local_d8._0_8_ =
           (_Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)
           0x0;
      if (_Stack_100._M_p != local_f8 + 8) {
        operator_delete(_Stack_100._M_p,local_f8._8_8_ + 1);
      }
      if ((char *)local_d8._16_8_ != aaStack_c0[0]._M_local_buf + 8) {
        operator_delete((void *)local_d8._16_8_,(ulong)(aaStack_c0[0]._8_8_ + 1));
      }
      if ((this_00->m_current).type != COMMA) break;
      advance(this_00);
    }
    local_108 = (undefined1  [8])local_f8;
    local_d8._16_8_ = (pointer)0x1f;
    local_108 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_d8 + 0x10));
    local_f8._0_8_ = local_d8._16_8_;
    builtin_strncpy((char *)local_108,"Expected end of parameter list.",0x1f);
    _Stack_100._M_p = (pointer)local_d8._16_8_;
    *(char *)((long)local_108 + local_d8._16_8_) = '\0';
    expect(this_00,RIGHT_PAREN,(string *)local_108);
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
    }
  }
  local_108 = (undefined1  [8])local_f8;
  local_d8._16_8_ = (pointer)0x19;
  local_108 = (undefined1  [8])
              std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_d8 + 0x10));
  local_f8._0_8_ = local_d8._16_8_;
  builtin_strncpy((char *)local_108,"Expected return typename.",0x19);
  _Stack_100._M_p = (pointer)local_d8._16_8_;
  *(char *)((long)local_108 + local_d8._16_8_) = '\0';
  expectTypenamePrecUnary((Parser *)local_a0,(string *)this_00,SUB81(local_108,0));
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108,local_f8._0_8_ + 1);
  }
  if ((local_74 == '\0') && ((this_00->m_current).type == SEMICOLON)) {
    local_d8._16_8_ = 0;
    aaStack_c0[0]._M_allocated_capacity = 0;
    aaStack_c0[0]._8_8_ = 0;
    puVar8 = (undefined8 *)operator_new(0x38);
    local_108._0_4_ = (this_00->m_previous).type;
    pcVar3 = local_f8 + 8;
    pcVar4 = (this_00->m_previous).lexeme._M_dataplus._M_p;
    _Stack_100._M_p = pcVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_100,pcVar4,pcVar4 + (this_00->m_previous).lexeme._M_string_length);
    *puVar8 = &PTR__UnitExpr_00126f10;
    *(undefined4 *)(puVar8 + 1) = local_108._0_4_;
    puVar8[2] = puVar8 + 4;
    if (_Stack_100._M_p == pcVar3) {
      puVar8[4] = local_f8._8_8_;
      puVar8[5] = local_f8._16_8_;
    }
    else {
      puVar8[2] = _Stack_100._M_p;
      puVar8[4] = local_f8._8_8_;
    }
    puVar8[3] = local_f8._0_8_;
    *(line_t *)(puVar8 + 6) = *plVar1;
    *(col_t *)((long)puVar8 + 0x34) = (this_00->m_previous).col;
    puVar10 = (undefined8 *)operator_new(0x28);
    uVar6 = aaStack_c0[0]._8_8_;
    uVar5 = aaStack_c0[0]._M_allocated_capacity;
    uVar11 = local_d8._16_8_;
    local_d8._16_8_ = (pointer)0x0;
    aaStack_c0[0]._M_allocated_capacity = (_func_int *)0x0;
    aaStack_c0[0]._8_8_ = (_func_int *)0x0;
    *puVar10 = &PTR__BlockExpr_00126f68;
    puVar10[1] = uVar11;
    puVar10[2] = uVar5;
    puVar10[3] = uVar6;
    local_f8._0_8_ = (undefined1 *)0x0;
    local_108 = (undefined1  [8])0x0;
    _Stack_100._M_p = (pointer)0x0;
    puVar10[4] = puVar8;
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)local_108);
    puVar8 = (undefined8 *)operator_new(0x60);
    uVar11 = local_48._8_8_;
    local_108._0_4_ = (line_t)local_70;
    _Stack_100._M_p = pcVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_100,local_68,(_func_int *)((long)local_60 + (long)local_68));
    local_dc = local_48._M_allocated_capacity._4_2_;
    local_e0 = local_48._M_allocated_capacity._0_4_;
    *puVar8 = &PTR__FunctionStmt_00126fb0;
    *(undefined4 *)(puVar8 + 1) = local_108._0_4_;
    puVar8[2] = puVar8 + 4;
    if (_Stack_100._M_p == pcVar3) {
      puVar8[4] = local_f8._8_8_;
      puVar8[5] = local_f8._16_8_;
    }
    else {
      puVar8[2] = _Stack_100._M_p;
      puVar8[4] = local_f8._8_8_;
    }
    puVar8[3] = local_f8._0_8_;
    *(undefined4 *)(puVar8 + 6) = local_48._M_allocated_capacity._0_4_;
    *(undefined2 *)((long)puVar8 + 0x34) = local_48._M_allocated_capacity._4_2_;
    puVar8[7] = local_a0._0_8_;
    puVar8[8] = local_a0._8_8_;
    puVar8[9] = _Stack_90._M_p;
    puVar8[10] = local_88._M_allocated_capacity;
    local_a0._8_8_ = (pointer)0x0;
    _Stack_90._M_p = (pointer)0x0;
    local_88._M_allocated_capacity = 0;
    puVar8[0xb] = puVar10;
    *(undefined8 **)uVar11 = puVar8;
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)(local_d8 + 0x10));
  }
  else {
    local_108 = (undefined1  [8])local_f8;
    local_d8._16_8_ = (pointer)0x2a;
    local_108 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_d8 + 0x10));
    local_f8._0_8_ = local_d8._16_8_;
    builtin_strncpy((char *)local_108,"Expected \'{\' or \'=>\' before function body.",0x2a);
    _Stack_100._M_p = (pointer)local_d8._16_8_;
    *(char *)((long)local_108 + local_d8._16_8_) = '\0';
    expectBlock((Parser *)&stack0xffffffffffffffc8,(string *)this_00);
    uVar11 = local_48._8_8_;
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._0_8_ + 1));
    }
    SVar9._vptr_Stmt = (_func_int **)operator_new(0x60);
    pp_Var7 = local_60;
    if (local_68 == &local_58) {
      local_f8._16_8_ = local_58._8_8_;
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_f8 + 8);
    }
    local_f8._9_7_ = local_58._M_allocated_capacity._1_7_;
    local_f8[8] = local_58._M_local_buf[0];
    local_60 = (__buckets_ptr)0x0;
    local_58._M_local_buf[0] = '\0';
    *SVar9._vptr_Stmt = (_func_int *)&PTR__FunctionStmt_00126fb0;
    *(line_t *)(SVar9._vptr_Stmt + 1) = (line_t)local_70;
    SVar9._vptr_Stmt[2] = (_func_int *)(SVar9._vptr_Stmt + 4);
    if (local_68 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f8 + 8)) {
      SVar9._vptr_Stmt[4] = (_func_int *)local_f8._8_8_;
      SVar9._vptr_Stmt[5] = (_func_int *)local_f8._16_8_;
    }
    else {
      SVar9._vptr_Stmt[2] = (_func_int *)local_68;
      SVar9._vptr_Stmt[4] = (_func_int *)local_f8._8_8_;
    }
    SVar9._vptr_Stmt[3] = (_func_int *)pp_Var7;
    *(undefined4 *)(SVar9._vptr_Stmt + 6) = local_48._M_allocated_capacity._0_4_;
    *(undefined2 *)((long)SVar9._vptr_Stmt + 0x34) = local_48._M_allocated_capacity._4_2_;
    SVar9._vptr_Stmt[7] = (_func_int *)local_a0._0_8_;
    SVar9._vptr_Stmt[8] = (_func_int *)local_a0._8_8_;
    SVar9._vptr_Stmt[9] = (_func_int *)_Stack_90._M_p;
    SVar9._vptr_Stmt[10] = (_func_int *)local_88._M_allocated_capacity;
    local_a0._8_8_ = (pointer)0x0;
    _Stack_90._M_p = (pointer)0x0;
    local_88._M_allocated_capacity = 0;
    SVar9._vptr_Stmt[0xb] = (_func_int *)local_38;
    *(_func_int ***)uVar11 = SVar9._vptr_Stmt;
    local_68 = &local_58;
  }
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::~vector
            ((vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *)
             (local_a0 + 8));
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                             + 1);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_>)uVar11;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseFunctionStmt(bool mustParseBody) {
        expect(TokenType::IDENTIFIER, "Expected function name.");
        Token name = m_previous;

        expect(TokenType::LEFT_PAREN, "Expected '(' after function name.");

        std::vector<FunctionStmt::Param> params;
        if (!consume(TokenType::RIGHT_PAREN)) {
            do {
                expect(TokenType::IDENTIFIER, "Expected parameter name.");
                params.push_back(FunctionStmt::Param{m_previous, expectTypename("Expected parameter typename.")});
            } while (consume(TokenType::COMMA));

            expect(TokenType::RIGHT_PAREN, "Expected end of parameter list.");
        }

        // Get the return type
        // At second-lowest precedence to force grouping of function types (because of => ambiguity)
        std::unique_ptr<const Typename> returnTypename =
                expectTypenamePrecUnary("Expected return typename.", true);

        if (!mustParseBody && check(TokenType::SEMICOLON)) {
            return std::make_unique<FunctionStmt>(name,
                                                  std::move(returnTypename),
                                                  std::move(params),
                                                  std::make_unique<BlockExpr>(std::vector<std::unique_ptr<Stmt>>{},
                                                                              std::make_unique<UnitExpr>(m_previous)));
        }

        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before function body.");
        return std::make_unique<FunctionStmt>(std::move(name), std::move(returnTypename), std::move(params), std::move(body));
    }